

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O2

axbStatus_t op_vec_min(axbVec_s *x,size_t *idx,axbScalar_s *m,void *aux_data)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  double dVar5;
  
  pdVar2 = (double *)x->data;
  pdVar3 = (double *)m->data;
  dVar5 = *pdVar2;
  *idx = 0;
  for (uVar4 = 1; uVar4 < x->size; uVar4 = uVar4 + 1) {
    dVar1 = pdVar2[uVar4];
    if (dVar1 < dVar5) {
      *idx = uVar4;
      dVar5 = dVar1;
    }
  }
  *pdVar3 = dVar5;
  return 0;
}

Assistant:

static axbStatus_t op_vec_min(const struct axbVec_s *x, size_t *idx, struct axbScalar_s *m, void *aux_data)
{
  (void)aux_data;

  const double *d_x   = (const double*)x->data;
        double *d_min =       (double*)m->data;

  double cur_min = d_x[0];
  *idx = 0;
  for (size_t i=1; i<x->size; ++i) {
    if (d_x[i] < cur_min) {
      cur_min = d_x[i];
      *idx = i;
    }
  }
  *d_min = cur_min;

  return 0;
}